

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_backend.c
# Opt level: O0

int ossl_ec_encoding_name2id(char *name)

{
  int iVar1;
  char *in_RDI;
  size_t sz;
  size_t i;
  ulong local_18;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 1;
  }
  else {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      iVar1 = strcasecmp(in_RDI,(char *)encoding_nameid_map[local_18].ptr);
      if (iVar1 == 0) {
        return encoding_nameid_map[local_18].id;
      }
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int ossl_ec_encoding_name2id(const char *name)
{
    size_t i, sz;

    /* Return the default value if there is no name */
    if (name == NULL)
        return OPENSSL_EC_NAMED_CURVE;

    for (i = 0, sz = OSSL_NELEM(encoding_nameid_map); i < sz; i++) {
        if (strcasecmp(name, encoding_nameid_map[i].ptr) == 0)
            return encoding_nameid_map[i].id;
    }
    return -1;
}